

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

void vkt::texture::anon_unknown_0::populateTextureMipmappingTests
               (TestCaseGroup *textureMipmappingTests)

{
  int iVar1;
  TestContext *testCtx_00;
  TestCaseGroup *pTVar2;
  ostream *poVar3;
  TestNode *pTVar4;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance> *pTVar5;
  char *pcVar6;
  TestNode *pTVar7;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMinLodTestInstance> *this;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMaxLodTestInstance> *this_00;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DBaseLevelTestInstance> *this_01;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMaxLevelTestInstance> *this_02;
  TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMipmapTestInstance> *this_03;
  TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMinLodTestInstance> *this_04;
  TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMaxLodTestInstance> *this_05;
  TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance> *this_06;
  TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMaxLevelTestInstance> *this_07;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance> *pTVar8;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMinLodTestInstance> *this_08;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLodTestInstance> *this_09;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DBaseLevelTestInstance> *this_10;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance> *this_11;
  allocator<char> local_13d9;
  string local_13d8;
  allocator<char> local_13b1;
  string local_13b0;
  value_type local_138c;
  undefined1 local_1388 [8];
  Texture3DMipmapTestCaseParameters testParameters_16;
  int minFilter_16;
  allocator<char> local_1301;
  string local_1300;
  value_type local_12dc;
  undefined1 local_12d8 [8];
  Texture3DMipmapTestCaseParameters testParameters_15;
  int minFilter_15;
  allocator<char> local_1251;
  string local_1250;
  value_type local_122c;
  undefined1 local_1228 [8];
  Texture3DMipmapTestCaseParameters testParameters_14;
  int minFilter_14;
  allocator<char> local_11a1;
  string local_11a0;
  value_type local_117c;
  undefined1 local_1178 [8];
  Texture3DMipmapTestCaseParameters testParameters_13;
  int minFilter_13;
  allocator<char> local_10f1;
  string local_10f0;
  value_type local_10d0 [2];
  undefined1 local_10c8 [8];
  Texture3DMipmapTestCaseParameters testParameters_12;
  int minFilter_12;
  allocator<char> local_1041;
  string local_1040 [32];
  string local_1020;
  ostringstream local_1000 [8];
  ostringstream name_3;
  int local_e88;
  value_type local_e84;
  int size_1;
  Texture3DMipmapTestCaseParameters testParameters_11;
  int sizeEnd_1;
  int wrapMode_2;
  int minFilter_11;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> coordTypeGroup_2;
  int coordType_2;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> maxLevelGroup3D;
  undefined1 local_de8 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> baseLevelGroup3D;
  undefined1 local_dd0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> maxLodGroup3D;
  undefined1 local_db8 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> minLodGroup3D;
  undefined1 local_da0 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> biasGroup3D;
  undefined1 local_d88 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group3D;
  string local_d70;
  allocator<char> local_d49;
  string local_d48;
  value_type local_d24;
  undefined1 local_d20 [8];
  TextureCubeMipmapTestCaseParameters testParameters_10;
  int minFilter_10;
  allocator<char> local_ca1;
  string local_ca0;
  value_type local_c7c;
  undefined1 local_c78 [8];
  TextureCubeMipmapTestCaseParameters testParameters_9;
  int minFilter_9;
  allocator<char> local_bf9;
  string local_bf8;
  value_type local_bd4;
  undefined1 local_bd0 [8];
  TextureCubeMipmapTestCaseParameters testParameters_8;
  int minFilter_8;
  allocator<char> local_b51;
  string local_b50;
  value_type local_b2c;
  undefined1 local_b28 [8];
  TextureCubeMipmapTestCaseParameters testParameters_7;
  int minFilter_7;
  allocator<char> local_aa9;
  string local_aa8 [32];
  string local_a88;
  ostringstream local_a68 [8];
  ostringstream name_2;
  value_type local_8f0 [2];
  undefined1 local_8e8 [8];
  TextureCubeMipmapTestCaseParameters testParameters_6;
  int wrapMode_1;
  int magFilter;
  int minFilter_6;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> coordTypeGroup_1;
  int coordType_1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> maxLevelGroupCube;
  undefined1 local_858 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> baseLevelGroupCube;
  undefined1 local_840 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> maxLodGroupCube;
  undefined1 local_828 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> minLodGroupCube;
  undefined1 local_810 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> groupCube;
  string local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  value_type local_7ac;
  undefined1 local_7a8 [8];
  Texture2DMipmapTestCaseParameters testParameters_5;
  int minFilter_5;
  allocator<char> local_729;
  string local_728;
  value_type local_704;
  undefined1 local_700 [8];
  Texture2DMipmapTestCaseParameters testParameters_4;
  int minFilter_4;
  allocator<char> local_681;
  string local_680;
  value_type local_65c;
  undefined1 local_658 [8];
  Texture2DMipmapTestCaseParameters testParameters_3;
  int minFilter_3;
  allocator<char> local_5d9;
  string local_5d8;
  value_type local_5b4;
  undefined1 local_5b0 [8];
  Texture2DMipmapTestCaseParameters testParameters_2;
  int minFilter_2;
  allocator<char> local_531;
  string local_530 [32];
  string local_510;
  ostringstream local_4f0 [8];
  ostringstream name_1;
  value_type local_374;
  undefined1 local_370 [8];
  Texture2DMipmapTestCaseParameters testParameters_1;
  int minFilter_1;
  allocator<char> local_2f1;
  string local_2f0 [32];
  string local_2d0;
  ostringstream local_2b0 [8];
  ostringstream name;
  value_type local_134;
  undefined1 local_130 [8];
  Texture2DMipmapTestCaseParameters testParameters;
  int size;
  int sizeEnd;
  int wrapMode;
  int minFilter;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> coordTypeGroup;
  int coordType;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> maxLevelGroup2D;
  undefined1 local_98 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> baseLevelGroup2D;
  undefined1 local_80 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> maxLodGroup2D;
  undefined1 local_68 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> minLodGroup2D;
  undefined1 local_50 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> biasGroup2D;
  undefined1 local_30 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group2D;
  int cubeMapSize;
  TestContext *testCtx;
  TestCaseGroup *textureMipmappingTests_local;
  
  testCtx_00 = tcu::TestNode::getTestContext(&textureMipmappingTests->super_TestNode);
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _12_4_ = 0x40;
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"2d","2D Mipmap Filtering");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &biasGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xb);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30,pTVar2
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"bias","User-supplied bias value");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &minLodGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_50,pTVar2
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"min_lod","Lod control: min lod");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &maxLodGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_68,pTVar2
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"max_lod","Lod control: max lod");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &baseLevelGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_80,pTVar2
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"base_level","Base level");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &maxLevelGroup2D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_98,pTVar2
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"max_level","Max level");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &coordTypeGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&coordType,
             pTVar2);
  for (coordTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._8_4_ = 0;
      (int)coordTypeGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _8_4_ < 3;
      coordTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._8_4_ = coordTypeGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_ + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,testCtx_00,
               populateTextureMipmappingTests::coordTypes
               [(int)coordTypeGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].name,
               populateTextureMipmappingTests::coordTypes
               [(int)coordTypeGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].desc);
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&wrapMode + 3));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&minFilter,
               pTVar2);
    for (sizeEnd = 0; sizeEnd < 4; sizeEnd = sizeEnd + 1) {
      for (size = 0; size < 3; size = size + 1) {
        iVar1 = 1;
        if (populateTextureMipmappingTests::coordTypes
            [(int)coordTypeGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data._8_4_].type == COORDTYPE_BASIC) {
          iVar1 = 3;
        }
        for (testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ = 0;
            testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ < iVar1;
            testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ =
                 testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ + 1)
        {
          Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
                    ((Texture2DMipmapTestCaseParameters *)local_130);
          testParameters.super_Texture2DTestCaseParameters.width =
               populateTextureMipmappingTests::coordTypes
               [(int)coordTypeGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].type;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          sampleCount = populateTextureMipmappingTests::minFilterModes[sizeEnd].mode;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          minFilter = populateTextureMipmappingTests::wrapModes[size].mode;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          magFilter = populateTextureMipmappingTests::wrapModes[size].mode;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          wrapS = 0x25;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               populateTextureMipmappingTests::tex2DSizes
               [testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_].
               width;
          testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
          programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               populateTextureMipmappingTests::tex2DSizes
               [testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_].
               height;
          local_134 = PROGRAM_2D_FLOAT;
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     *)&testParameters.super_Texture2DTestCaseParameters.
                        super_TextureCommonTestCaseParameters.format,&local_134);
          std::__cxx11::ostringstream::ostringstream(local_2b0);
          poVar3 = std::operator<<((ostream *)local_2b0,
                                   populateTextureMipmappingTests::minFilterModes[sizeEnd].name);
          poVar3 = std::operator<<(poVar3,"_");
          std::operator<<(poVar3,populateTextureMipmappingTests::wrapModes[size].name);
          if (populateTextureMipmappingTests::tex2DSizes
              [testParameters.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_].name
              != (char *)0x0) {
            poVar3 = std::operator<<((ostream *)local_2b0,"_");
            std::operator<<(poVar3,populateTextureMipmappingTests::tex2DSizes
                                   [testParameters.super_TextureMipmapCommonTestCaseParameters.
                                    minFilterName._4_4_].name);
          }
          pTVar4 = &de::details::
                    UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                    operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                *)&minFilter)->super_TestNode;
          pTVar5 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                    *)operator_new(0xc0);
          testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,pcVar6,&local_2f1)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&minFilter_1,"",
                     (allocator<char> *)
                     ((long)&testParameters_1.super_TextureMipmapCommonTestCaseParameters.
                             minFilterName + 7));
          util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>::
          TextureTestCase(pTVar5,testCtx_00,&local_2d0,(string *)&minFilter_1,
                          (ParameterType *)local_130);
          testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
          tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar5);
          std::__cxx11::string::~string((string *)&minFilter_1);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&testParameters_1.super_TextureMipmapCommonTestCaseParameters.
                             minFilterName + 7));
          std::__cxx11::string::~string((string *)&local_2d0);
          std::allocator<char>::~allocator(&local_2f1);
          std::__cxx11::string::~string(local_2f0);
          std::__cxx11::ostringstream::~ostringstream(local_2b0);
          Texture2DMipmapTestCaseParameters::~Texture2DMipmapTestCaseParameters
                    ((Texture2DMipmapTestCaseParameters *)local_130);
        }
      }
    }
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_30)->super_TestNode;
    pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      &minFilter)->super_TestNode;
    tcu::TestNode::addChild(pTVar4,pTVar7);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&minFilter);
  }
  for (testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_370);
    testParameters_1.super_Texture2DTestCaseParameters.width = 1;
    testParameters_1.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName].
                  mode;
    testParameters_1.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    texCoordPrecision =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName].mode;
    testParameters_1.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    minFilter = NEAREST_MIPMAP_NEAREST;
    testParameters_1.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    magFilter = NEAREST_MIPMAP_NEAREST;
    testParameters_1.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.wrapS =
         0x25;
    testParameters_1.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    programs.
    super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x40;
    testParameters_1.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    programs.
    super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x40;
    local_374 = PROGRAM_2D_FLOAT_BIAS;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_1.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_374);
    std::__cxx11::ostringstream::ostringstream(local_4f0);
    std::operator<<((ostream *)local_4f0,
                    populateTextureMipmappingTests::minFilterModes
                    [(int)testParameters_1.super_TextureMipmapCommonTestCaseParameters.minFilterName
                    ].name);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_50)->super_TestNode;
    pTVar5 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance> *)
             operator_new(0xc0);
    testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,pcVar6,&local_531);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_2,"",
               (allocator<char> *)
               ((long)&testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>::
    TextureTestCase(pTVar5,testCtx_00,&local_510,(string *)&minFilter_2,(ParameterType *)local_370);
    testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar5);
    std::__cxx11::string::~string((string *)&minFilter_2);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator(&local_531);
    std::__cxx11::string::~string(local_530);
    std::__cxx11::ostringstream::~ostringstream(local_4f0);
    Texture2DMipmapTestCaseParameters::~Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_370);
  }
  for (testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_5b0);
    testParameters_2.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName].
                  mode;
    local_5b4 = PROGRAM_2D_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_2.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_5b4);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_68)->super_TestNode;
    this = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMinLodTestInstance> *)
           operator_new(0xc0);
    testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_2.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,pcVar6,&local_5d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_3,"",
               (allocator<char> *)
               ((long)&testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMinLodTestInstance>::
    TextureTestCase(this,testCtx_00,&local_5d8,(string *)&minFilter_3,(ParameterType *)local_5b0);
    testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this);
    std::__cxx11::string::~string((string *)&minFilter_3);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator(&local_5d9);
    Texture2DMipmapTestCaseParameters::~Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_5b0);
  }
  for (testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_658);
    testParameters_3.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName].
                  mode;
    local_65c = PROGRAM_2D_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_3.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_65c);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_80)->super_TestNode;
    this_00 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMaxLodTestInstance> *)
              operator_new(0xc0);
    testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_3.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,pcVar6,&local_681);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_4,"",
               (allocator<char> *)
               ((long)&testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMaxLodTestInstance>::
    TextureTestCase(this_00,testCtx_00,&local_680,(string *)&minFilter_4,(ParameterType *)local_658)
    ;
    testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&minFilter_4);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_680);
    std::allocator<char>::~allocator(&local_681);
    Texture2DMipmapTestCaseParameters::~Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_658);
  }
  for (testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_700);
    testParameters_4.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName].
                  mode;
    testParameters_4.super_TextureMipmapCommonTestCaseParameters._0_8_ =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    local_704 = PROGRAM_2D_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_4.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_704);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_98)->super_TestNode;
    this_01 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DBaseLevelTestInstance>
               *)operator_new(0xc0);
    testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_4.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,pcVar6,&local_729);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_5,"",
               (allocator<char> *)
               ((long)&testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DBaseLevelTestInstance>::
    TextureTestCase(this_01,testCtx_00,&local_728,(string *)&minFilter_5,(ParameterType *)local_700)
    ;
    testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&minFilter_5);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_728);
    std::allocator<char>::~allocator(&local_729);
    Texture2DMipmapTestCaseParameters::~Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_700);
  }
  for (testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture2DMipmapTestCaseParameters::Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_7a8);
    testParameters_5.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName].
                  mode;
    testParameters_5.super_TextureMipmapCommonTestCaseParameters._0_8_ =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    local_7ac = PROGRAM_2D_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_5.super_Texture2DTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_7ac);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         &coordType)->super_TestNode;
    this_02 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMaxLevelTestInstance> *
              )operator_new(0xc0);
    groupCube.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    _14_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_5.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7d0,pcVar6,&local_7d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f8,"",
               (allocator<char> *)
               &groupCube.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMaxLevelTestInstance>::
    TextureTestCase(this_02,testCtx_00,&local_7d0,&local_7f8,(ParameterType *)local_7a8);
    groupCube.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    _14_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_02);
    std::__cxx11::string::~string((string *)&local_7f8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &groupCube.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    std::__cxx11::string::~string((string *)&local_7d0);
    std::allocator<char>::~allocator(&local_7d1);
    Texture2DMipmapTestCaseParameters::~Texture2DMipmapTestCaseParameters
              ((Texture2DMipmapTestCaseParameters *)local_7a8);
  }
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_30)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_50
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_30)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_68
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_30)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_80
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_30)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_98
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_30)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &coordType)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30
                   )->super_TestNode;
  tcu::TestNode::addChild(&textureMipmappingTests->super_TestNode,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&coordType);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_98);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_80);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_68);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_50);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_30);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"cubemap","Cube Mipmap Filtering");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &minLodGroupCube.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_810,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"min_lod","Lod control: min lod");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &maxLodGroupCube.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_828,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"max_lod","Lod control: max lod");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &baseLevelGroupCube.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_840,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"base_level","Base level");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &maxLevelGroupCube.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_858,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"max_level","Max level");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &coordTypeGroup_1.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&coordType_1,
             pTVar2);
  for (coordTypeGroup_1.
       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_4_ =
            0; (int)coordTypeGroup_1.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_4_ < 3;
      coordTypeGroup_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
      .m_data._8_4_ =
           coordTypeGroup_1.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _8_4_ + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,testCtx_00,
               populateTextureMipmappingTests::cubeCoordTypes
               [(int)coordTypeGroup_1.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].name,
               populateTextureMipmappingTests::cubeCoordTypes
               [(int)coordTypeGroup_1.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].desc);
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&magFilter + 3));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&minFilter_6,
               pTVar2);
    for (wrapMode_1 = 0; wrapMode_1 < 4; wrapMode_1 = wrapMode_1 + 1) {
      for (testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ = 0;
          testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ < 2;
          testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ =
               testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ + 1)
      {
        for (testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
            (int)testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName < 3;
            testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
                 (int)testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1
            ) {
          TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
                    ((TextureCubeMipmapTestCaseParameters *)local_8e8);
          testParameters_6.super_TextureCubeTestCaseParameters.size =
               populateTextureMipmappingTests::cubeCoordTypes
               [(int)coordTypeGroup_1.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].type;
          testParameters_6.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters
          .sampleCount = populateTextureMipmappingTests::minFilterModes[wrapMode_1].mode;
          testParameters_6.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters
          .texCoordPrecision =
               populateTextureMipmappingTests::magFilterModes
               [testParameters_6.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_].
               mode;
          testParameters_6.super_TextureMipmapCommonTestCaseParameters._0_8_ =
               populateTextureMipmappingTests::minFilterModes[wrapMode_1].name;
          testParameters_6.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters
          .minFilter = populateTextureMipmappingTests::wrapModes
                       [(int)testParameters_6.super_TextureMipmapCommonTestCaseParameters.
                             minFilterName].mode;
          testParameters_6.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters
          .magFilter = populateTextureMipmappingTests::wrapModes
                       [(int)testParameters_6.super_TextureMipmapCommonTestCaseParameters.
                             minFilterName].mode;
          testParameters_6.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters
          .wrapS = 0x25;
          testParameters_6.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters
          .programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x40;
          local_8f0[1] = 0x10;
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     *)&testParameters_6.super_TextureCubeTestCaseParameters.
                        super_TextureCommonTestCaseParameters.format,local_8f0 + 1);
          local_8f0[0] = PROGRAM_CUBE_FLOAT_BIAS;
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                     *)&testParameters_6.super_TextureCubeTestCaseParameters.
                        super_TextureCommonTestCaseParameters.format,local_8f0);
          std::__cxx11::ostringstream::ostringstream(local_a68);
          poVar3 = std::operator<<((ostream *)local_a68,
                                   populateTextureMipmappingTests::minFilterModes[wrapMode_1].name);
          poVar3 = std::operator<<(poVar3,"_");
          poVar3 = std::operator<<(poVar3,populateTextureMipmappingTests::magFilterModes
                                          [testParameters_6.
                                           super_TextureMipmapCommonTestCaseParameters.minFilterName
                                           ._4_4_].name);
          poVar3 = std::operator<<(poVar3,"_");
          std::operator<<(poVar3,populateTextureMipmappingTests::wrapModes
                                 [(int)testParameters_6.super_TextureMipmapCommonTestCaseParameters.
                                       minFilterName].name);
          pTVar4 = &de::details::
                    UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                    operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                *)&minFilter_6)->super_TestNode;
          this_03 = (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMipmapTestInstance>
                     *)operator_new(0xc0);
          testParameters_7.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_a88,pcVar6,&local_aa9)
          ;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&minFilter_7,"",
                     (allocator<char> *)
                     ((long)&testParameters_7.super_TextureMipmapCommonTestCaseParameters.
                             minFilterName + 7));
          util::TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMipmapTestInstance>
          ::TextureTestCase(this_03,testCtx_00,&local_a88,(string *)&minFilter_7,
                            (ParameterType *)local_8e8);
          testParameters_7.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
          tcu::TestNode::addChild(pTVar4,(TestNode *)this_03);
          std::__cxx11::string::~string((string *)&minFilter_7);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&testParameters_7.super_TextureMipmapCommonTestCaseParameters.
                             minFilterName + 7));
          std::__cxx11::string::~string((string *)&local_a88);
          std::allocator<char>::~allocator(&local_aa9);
          std::__cxx11::string::~string(local_aa8);
          std::__cxx11::ostringstream::~ostringstream(local_a68);
          TextureCubeMipmapTestCaseParameters::~TextureCubeMipmapTestCaseParameters
                    ((TextureCubeMipmapTestCaseParameters *)local_8e8);
        }
      }
    }
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_810)->super_TestNode;
    pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      &minFilter_6)->super_TestNode;
    tcu::TestNode::addChild(pTVar4,pTVar7);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&minFilter_6)
    ;
  }
  for (testParameters_7.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_7.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_7.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_7.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)local_b28);
    testParameters_7.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_7.super_TextureMipmapCommonTestCaseParameters.minFilterName].
                  mode;
    local_b2c = PROGRAM_CUBE_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_7.super_TextureCubeTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_b2c);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_828)->super_TestNode;
    this_04 = (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMinLodTestInstance> *
              )operator_new(0xc0);
    testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_7.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b50,pcVar6,&local_b51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_8,"",
               (allocator<char> *)
               ((long)&testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMinLodTestInstance>::
    TextureTestCase(this_04,testCtx_00,&local_b50,(string *)&minFilter_8,(ParameterType *)local_b28)
    ;
    testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_04);
    std::__cxx11::string::~string((string *)&minFilter_8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_b50);
    std::allocator<char>::~allocator(&local_b51);
    TextureCubeMipmapTestCaseParameters::~TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)local_b28);
  }
  for (testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)local_bd0);
    testParameters_8.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName].
                  mode;
    local_bd4 = PROGRAM_CUBE_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_8.super_TextureCubeTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_bd4);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_840)->super_TestNode;
    this_05 = (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMaxLodTestInstance> *
              )operator_new(0xc0);
    testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_8.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bf8,pcVar6,&local_bf9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_9,"",
               (allocator<char> *)
               ((long)&testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMaxLodTestInstance>::
    TextureTestCase(this_05,testCtx_00,&local_bf8,(string *)&minFilter_9,(ParameterType *)local_bd0)
    ;
    testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_05);
    std::__cxx11::string::~string((string *)&minFilter_9);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_bf8);
    std::allocator<char>::~allocator(&local_bf9);
    TextureCubeMipmapTestCaseParameters::~TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)local_bd0);
  }
  for (testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)local_c78);
    testParameters_9.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName].
                  mode;
    testParameters_9.super_TextureMipmapCommonTestCaseParameters._0_8_ =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    local_c7c = PROGRAM_CUBE_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_9.super_TextureCubeTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_c7c);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_858)->super_TestNode;
    this_06 = (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance>
               *)operator_new(0xc0);
    testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_9.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ca0,pcVar6,&local_ca1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_10,"",
               (allocator<char> *)
               ((long)&testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeBaseLevelTestInstance>::
    TextureTestCase(this_06,testCtx_00,&local_ca0,(string *)&minFilter_10,(ParameterType *)local_c78
                   );
    testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_06);
    std::__cxx11::string::~string((string *)&minFilter_10);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_ca0);
    std::allocator<char>::~allocator(&local_ca1);
    TextureCubeMipmapTestCaseParameters::~TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)local_c78);
  }
  for (testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    TextureCubeMipmapTestCaseParameters::TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)local_d20);
    testParameters_10.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
    sampleCount = populateTextureMipmappingTests::minFilterModes
                  [(int)testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName]
                  .mode;
    testParameters_10.super_TextureMipmapCommonTestCaseParameters._0_8_ =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    local_d24 = PROGRAM_CUBE_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_10.super_TextureCubeTestCaseParameters.
               super_TextureCommonTestCaseParameters.format,&local_d24);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         &coordType_1)->super_TestNode;
    this_07 = (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMaxLevelTestInstance>
               *)operator_new(0xc0);
    group3D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    _14_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_10.super_TextureMipmapCommonTestCaseParameters.minFilterName].name
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d48,pcVar6,&local_d49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d70,"",
               (allocator<char> *)
               &group3D.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeMaxLevelTestInstance>::
    TextureTestCase(this_07,testCtx_00,&local_d48,&local_d70,(ParameterType *)local_d20);
    group3D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    _14_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_07);
    std::__cxx11::string::~string((string *)&local_d70);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &group3D.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    std::__cxx11::string::~string((string *)&local_d48);
    std::allocator<char>::~allocator(&local_d49);
    TextureCubeMipmapTestCaseParameters::~TextureCubeMipmapTestCaseParameters
              ((TextureCubeMipmapTestCaseParameters *)local_d20);
  }
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_810)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_828)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_810)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_840)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_810)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_858)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_810)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &coordType_1)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_810)->super_TestNode;
  tcu::TestNode::addChild(&textureMipmappingTests->super_TestNode,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&coordType_1);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_858);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_840);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_828);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_810);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"3d","3D Mipmap Filtering");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &biasGroup3D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_d88,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"bias","User-supplied bias value");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &minLodGroup3D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_da0,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"min_lod","Lod control: min lod");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &maxLodGroup3D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_db8,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"max_lod","Lod control: max lod");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &baseLevelGroup3D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_dd0,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"base_level","Base level");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &maxLevelGroup3D.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_de8,
             pTVar2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar2,testCtx_00,"max_level","Max level");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &coordTypeGroup_2.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&coordType_2,
             pTVar2);
  for (coordTypeGroup_2.
       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_4_ =
            0; (int)coordTypeGroup_2.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_4_ < 3;
      coordTypeGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
      .m_data._8_4_ =
           coordTypeGroup_2.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _8_4_ + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,testCtx_00,
               populateTextureMipmappingTests::coordTypes
               [(int)coordTypeGroup_2.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].name,
               populateTextureMipmappingTests::coordTypes
               [(int)coordTypeGroup_2.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].desc);
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&wrapMode_2 + 3));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&minFilter_11
               ,pTVar2);
    for (sizeEnd_1 = 0; sizeEnd_1 < 4; sizeEnd_1 = sizeEnd_1 + 1) {
      for (testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ = 0;
          testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ < 3;
          testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ =
               testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_ + 1
          ) {
        testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
             (populateTextureMipmappingTests::coordTypes
              [(int)coordTypeGroup_2.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_4_].type == COORDTYPE_BASIC) + 1;
        Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
                  ((Texture3DMipmapTestCaseParameters *)&size_1);
        testParameters_11.super_Texture3DTestCaseParameters.wrapR =
             populateTextureMipmappingTests::coordTypes
             [(int)coordTypeGroup_2.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_4_].type;
        testParameters_11.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.sampleCount =
             populateTextureMipmappingTests::minFilterModes[sizeEnd_1].mode;
        testParameters_11.super_TextureMipmapCommonTestCaseParameters._0_8_ =
             populateTextureMipmappingTests::minFilterModes[sizeEnd_1].name;
        testParameters_11.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width
             = populateTextureMipmappingTests::wrapModes
               [testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_].
               mode;
        testParameters_11.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter =
             populateTextureMipmappingTests::wrapModes
             [testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_].
             mode;
        testParameters_11.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.magFilter =
             populateTextureMipmappingTests::wrapModes
             [testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName._4_4_].
             mode;
        testParameters_11.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.wrapS = 0x25;
        local_e84 = PROGRAM_3D_FLOAT;
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                   *)&testParameters_11.super_Texture3DTestCaseParameters.
                      super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.format
                  ,&local_e84);
        for (local_e88 = 0;
            local_e88 <
            (int)testParameters_11.super_TextureMipmapCommonTestCaseParameters.minFilterName;
            local_e88 = local_e88 + 1) {
          testParameters_11.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               populateTextureMipmappingTests::tex3DSizes[local_e88].width;
          testParameters_11.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          super_TextureCommonTestCaseParameters.programs.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
               populateTextureMipmappingTests::tex3DSizes[local_e88].height;
          testParameters_11.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
          height = populateTextureMipmappingTests::tex3DSizes[local_e88].depth;
          std::__cxx11::ostringstream::ostringstream(local_1000);
          poVar3 = std::operator<<((ostream *)local_1000,
                                   populateTextureMipmappingTests::minFilterModes[sizeEnd_1].name);
          poVar3 = std::operator<<(poVar3,"_");
          std::operator<<(poVar3,populateTextureMipmappingTests::wrapModes
                                 [testParameters_11.super_TextureMipmapCommonTestCaseParameters.
                                  minFilterName._4_4_].name);
          if (populateTextureMipmappingTests::tex3DSizes[local_e88].name != (char *)0x0) {
            poVar3 = std::operator<<((ostream *)local_1000,"_");
            std::operator<<(poVar3,populateTextureMipmappingTests::tex3DSizes[local_e88].name);
          }
          pTVar4 = &de::details::
                    UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                    operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                                *)&minFilter_11)->super_TestNode;
          pTVar8 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>
                    *)operator_new(200);
          testParameters_12.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1020,pcVar6,&local_1041);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&minFilter_12,"",
                     (allocator<char> *)
                     ((long)&testParameters_12.super_TextureMipmapCommonTestCaseParameters.
                             minFilterName + 7));
          util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>::
          TextureTestCase(pTVar8,testCtx_00,&local_1020,(string *)&minFilter_12,
                          (ParameterType *)&size_1);
          testParameters_12.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
          tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar8);
          std::__cxx11::string::~string((string *)&minFilter_12);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&testParameters_12.super_TextureMipmapCommonTestCaseParameters.
                             minFilterName + 7));
          std::__cxx11::string::~string((string *)&local_1020);
          std::allocator<char>::~allocator(&local_1041);
          std::__cxx11::string::~string(local_1040);
          std::__cxx11::ostringstream::~ostringstream(local_1000);
        }
        Texture3DMipmapTestCaseParameters::~Texture3DMipmapTestCaseParameters
                  ((Texture3DMipmapTestCaseParameters *)&size_1);
      }
    }
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_d88)->super_TestNode;
    pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      &minFilter_11)->super_TestNode;
    tcu::TestNode::addChild(pTVar4,pTVar7);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&minFilter_11
              );
  }
  for (testParameters_12.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_12.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_12.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_12.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_10c8);
    testParameters_12.super_Texture3DTestCaseParameters.wrapR = CLAMP_TO_BORDER;
    testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.sampleCount =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_12.super_TextureMipmapCommonTestCaseParameters.minFilterName].mode;
    testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.width = 2;
    testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.minFilter = NEAREST_MIPMAP_NEAREST;
    testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.magFilter = NEAREST_MIPMAP_NEAREST;
    testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.wrapS = 0x25;
    testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.programs.
    super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20;
    testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.programs.
    super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x20;
    testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.height =
         0x20;
    local_10d0[1] = 0x20;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters
               .super_TextureCommonTestCaseParameters.format,local_10d0 + 1);
    local_10d0[0] = PROGRAM_3D_FLOAT_BIAS;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_12.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters
               .super_TextureCommonTestCaseParameters.format,local_10d0);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_da0)->super_TestNode;
    pTVar8 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance> *)
             operator_new(200);
    testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_12.super_TextureMipmapCommonTestCaseParameters.minFilterName].name
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_10f0,pcVar6,&local_10f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_13,"",
               (allocator<char> *)
               ((long)&testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>::
    TextureTestCase(pTVar8,testCtx_00,&local_10f0,(string *)&minFilter_13,
                    (ParameterType *)local_10c8);
    testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)pTVar8);
    std::__cxx11::string::~string((string *)&minFilter_13);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_10f0);
    std::allocator<char>::~allocator(&local_10f1);
    Texture3DMipmapTestCaseParameters::~Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_10c8);
  }
  for (testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_1178);
    testParameters_13.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.sampleCount =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName].mode;
    local_117c = PROGRAM_3D_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_13.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters
               .super_TextureCommonTestCaseParameters.format,&local_117c);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_db8)->super_TestNode;
    this_08 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMinLodTestInstance> *)
              operator_new(200);
    testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_13.super_TextureMipmapCommonTestCaseParameters.minFilterName].name
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11a0,pcVar6,&local_11a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_14,"",
               (allocator<char> *)
               ((long)&testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMinLodTestInstance>::
    TextureTestCase(this_08,testCtx_00,&local_11a0,(string *)&minFilter_14,
                    (ParameterType *)local_1178);
    testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_08);
    std::__cxx11::string::~string((string *)&minFilter_14);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_11a0);
    std::allocator<char>::~allocator(&local_11a1);
    Texture3DMipmapTestCaseParameters::~Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_1178);
  }
  for (testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_1228);
    testParameters_14.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.sampleCount =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName].mode;
    local_122c = PROGRAM_3D_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_14.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters
               .super_TextureCommonTestCaseParameters.format,&local_122c);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_dd0)->super_TestNode;
    this_09 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLodTestInstance> *)
              operator_new(200);
    testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_14.super_TextureMipmapCommonTestCaseParameters.minFilterName].name
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1250,pcVar6,&local_1251);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_15,"",
               (allocator<char> *)
               ((long)&testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLodTestInstance>::
    TextureTestCase(this_09,testCtx_00,&local_1250,(string *)&minFilter_15,
                    (ParameterType *)local_1228);
    testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_09);
    std::__cxx11::string::~string((string *)&minFilter_15);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_1250);
    std::allocator<char>::~allocator(&local_1251);
    Texture3DMipmapTestCaseParameters::~Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_1228);
  }
  for (testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_12d8);
    testParameters_15.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.sampleCount =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName].mode;
    testParameters_15.super_TextureMipmapCommonTestCaseParameters._0_8_ =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    local_12dc = PROGRAM_3D_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_15.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters
               .super_TextureCommonTestCaseParameters.format,&local_12dc);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_de8)->super_TestNode;
    this_10 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DBaseLevelTestInstance>
               *)operator_new(200);
    testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 1;
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_15.super_TextureMipmapCommonTestCaseParameters.minFilterName].name
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1300,pcVar6,&local_1301);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&minFilter_16,"",
               (allocator<char> *)
               ((long)&testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DBaseLevelTestInstance>::
    TextureTestCase(this_10,testCtx_00,&local_1300,(string *)&minFilter_16,
                    (ParameterType *)local_12d8);
    testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName._6_1_ = 0;
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_10);
    std::__cxx11::string::~string((string *)&minFilter_16);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName +
               7));
    std::__cxx11::string::~string((string *)&local_1300);
    std::allocator<char>::~allocator(&local_1301);
    Texture3DMipmapTestCaseParameters::~Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_12d8);
  }
  for (testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ = 0;
      (int)testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName < 4;
      testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName._0_4_ =
           (int)testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName + 1) {
    Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_1388);
    testParameters_16.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters.
    super_TextureCommonTestCaseParameters.sampleCount =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName].mode;
    testParameters_16.super_TextureMipmapCommonTestCaseParameters._0_8_ =
         populateTextureMipmappingTests::minFilterModes
         [(int)testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName].name;
    local_138c = PROGRAM_3D_FLOAT;
    std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
    push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
              &testParameters_16.super_Texture3DTestCaseParameters.super_Texture2DTestCaseParameters
               .super_TextureCommonTestCaseParameters.format,&local_138c);
    pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         &coordType_2)->super_TestNode;
    this_11 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance> *
              )operator_new(200);
    pcVar6 = populateTextureMipmappingTests::minFilterModes
             [(int)testParameters_16.super_TextureMipmapCommonTestCaseParameters.minFilterName].name
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_13b0,pcVar6,&local_13b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_13d8,"",&local_13d9);
    util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMaxLevelTestInstance>::
    TextureTestCase(this_11,testCtx_00,&local_13b0,&local_13d8,(ParameterType *)local_1388);
    tcu::TestNode::addChild(pTVar4,(TestNode *)this_11);
    std::__cxx11::string::~string((string *)&local_13d8);
    std::allocator<char>::~allocator(&local_13d9);
    std::__cxx11::string::~string((string *)&local_13b0);
    std::allocator<char>::~allocator(&local_13b1);
    Texture3DMipmapTestCaseParameters::~Texture3DMipmapTestCaseParameters
              ((Texture3DMipmapTestCaseParameters *)local_1388);
  }
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_d88)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_da0)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_d88)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_db8)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_d88)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_dd0)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_d88)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_de8)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_d88)->super_TestNode;
  pTVar7 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &coordType_2)->super_TestNode;
  tcu::TestNode::addChild(pTVar4,pTVar7);
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_d88)->super_TestNode;
  tcu::TestNode::addChild(&textureMipmappingTests->super_TestNode,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&coordType_2);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_de8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_dd0);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_db8);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_da0);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_d88);
  return;
}

Assistant:

void populateTextureMipmappingTests (tcu::TestCaseGroup* textureMipmappingTests)
{
	tcu::TestContext&	testCtx		= textureMipmappingTests->getTestContext();

	static const struct
	{
		const char*				name;
		const Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp",		Sampler::CLAMP_TO_EDGE		},
		{ "repeat",		Sampler::REPEAT_GL			},
		{ "mirror",		Sampler::MIRRORED_REPEAT_GL	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	Sampler::NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		Sampler::LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		Sampler::NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		Sampler::LINEAR_MIPMAP_LINEAR	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	mode;
	} magFilterModes[] =
	{
		{ "nearest",	Sampler::NEAREST},
		{ "linear",		Sampler::LINEAR}
	};


	static const struct
	{
		const CoordType		type;
		const char*			name;
		const char*			desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		const int		width;
		const int		height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "npot",		63, 57 },
		{ "non_square",	32, 64 }
	};

	static const struct
	{
		const char*		name;
		const int		width;
		const int		height;
		const int		depth;
	} tex3DSizes[] =
	{
		{ DE_NULL,		32, 32, 32 }, // Default.
		{ "npot",		33, 29, 27 }
	};

	const int cubeMapSize = 64;

	static const struct
	{
		const CoordType		type;
		const char*			name;
		const char*			desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// 2D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2D				(new tcu::TestCaseGroup(testCtx, "2d", "2D Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	biasGroup2D			(new tcu::TestCaseGroup(testCtx, "bias", "User-supplied bias value"));
		de::MovePtr<tcu::TestCaseGroup>	minLodGroup2D		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroup2D		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroup2D	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroup2D		(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup		(new tcu::TestCaseGroup(testCtx, coordTypes[coordType].name, coordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
				{
					// Add non_square variants to basic cases only.
					int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

					for (int size = 0; size < sizeEnd; size++)
					{
						Texture2DMipmapTestCaseParameters	testParameters;

						testParameters.coordType	= coordTypes[coordType].type;
						testParameters.minFilter	= minFilterModes[minFilter].mode;
						testParameters.wrapS		= wrapModes[wrapMode].mode;
						testParameters.wrapT		= wrapModes[wrapMode].mode;
						testParameters.format		= VK_FORMAT_R8G8B8A8_UNORM; //not sure (GL_RGBA)
						testParameters.width		= tex2DSizes[size].width;
						testParameters.height		= tex2DSizes[size].height;
						testParameters.programs.push_back(PROGRAM_2D_FLOAT);

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << wrapModes[wrapMode].name;

						if (tex2DSizes[size].name)
							name << "_" << tex2DSizes[size].name;

						coordTypeGroup->addChild(new TextureTestCase<Texture2DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			group2D->addChild(coordTypeGroup.release());
		}

		// 2D bias variants.
		{
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;

				testParameters.coordType	= COORDTYPE_BASIC_BIAS;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.magFilter	= minFilterModes[minFilter].mode;
				testParameters.wrapS		= Sampler::REPEAT_GL;
				testParameters.wrapT		= Sampler::REPEAT_GL;
				testParameters.format		= VK_FORMAT_R8G8B8A8_UNORM; //not sure (GL_RGBA)
				testParameters.width		= tex2DSizes[0].width;
				testParameters.height		= tex2DSizes[0].height;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT_BIAS);

				std::ostringstream name;
				name << minFilterModes[minFilter].name;

				biasGroup2D->addChild(new TextureTestCase<Texture2DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
			}
		}

		// 2D LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				minLodGroup2D->addChild(new TextureTestCase<Texture2DMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				maxLodGroup2D->addChild(new TextureTestCase<Texture2DMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				baseLevelGroup2D->addChild(new TextureTestCase<Texture2DBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				maxLevelGroup2D->addChild(new TextureTestCase<Texture2DMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		group2D->addChild(biasGroup2D.release());
		group2D->addChild(minLodGroup2D.release());
		group2D->addChild(maxLodGroup2D.release());
		group2D->addChild(baseLevelGroup2D.release());
		group2D->addChild(maxLevelGroup2D.release());

		textureMipmappingTests->addChild(group2D.release());
	}

	// Cubemap cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	groupCube			(new tcu::TestCaseGroup(testCtx, "cubemap", "Cube Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	minLodGroupCube		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroupCube		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroupCube	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroupCube	(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup	(new tcu::TestCaseGroup(testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int magFilter = 0; magFilter < DE_LENGTH_OF_ARRAY(magFilterModes); magFilter++)
				{
					for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
					{
						TextureCubeMipmapTestCaseParameters	testParameters;

						testParameters.coordType		= cubeCoordTypes[coordType].type;
						testParameters.minFilter		= minFilterModes[minFilter].mode;
						testParameters.magFilter		= magFilterModes[magFilter].mode;
						testParameters.minFilterName	= minFilterModes[minFilter].name;
						testParameters.wrapS			= wrapModes[wrapMode].mode;
						testParameters.wrapT			= wrapModes[wrapMode].mode;
						testParameters.format			= VK_FORMAT_R8G8B8A8_UNORM;
						testParameters.size				= cubeMapSize;
						testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);
						testParameters.programs.push_back(PROGRAM_CUBE_FLOAT_BIAS);

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << magFilterModes[magFilter].name
							 << "_" << wrapModes[wrapMode].name;

						coordTypeGroup->addChild(new TextureTestCase<TextureCubeMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			groupCube->addChild(coordTypeGroup.release());
		}

		// Cubemap LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				minLodGroupCube->addChild(new TextureTestCase<TextureCubeMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				maxLodGroupCube->addChild(new TextureTestCase<TextureCubeMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				baseLevelGroupCube->addChild(new TextureTestCase<TextureCubeBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				maxLevelGroupCube->addChild(new TextureTestCase<TextureCubeMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		groupCube->addChild(minLodGroupCube.release());
		groupCube->addChild(maxLodGroupCube.release());
		groupCube->addChild(baseLevelGroupCube.release());
		groupCube->addChild(maxLevelGroupCube.release());

		textureMipmappingTests->addChild(groupCube.release());
	}

	// 3D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group3D				(new tcu::TestCaseGroup(testCtx, "3d", "3D Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	biasGroup3D			(new tcu::TestCaseGroup(testCtx, "bias", "User-supplied bias value"));
		de::MovePtr<tcu::TestCaseGroup>	minLodGroup3D		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroup3D		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroup3D	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroup3D		(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup	(new tcu::TestCaseGroup(testCtx, coordTypes[coordType].name, coordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
				{
					// Add other size variants to basic cases only.
					int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex3DSizes) : 1;

					Texture3DMipmapTestCaseParameters	testParameters;

					testParameters.coordType		= coordTypes[coordType].type;
					testParameters.minFilter		= minFilterModes[minFilter].mode;
					testParameters.minFilterName	= minFilterModes[minFilter].name;
					testParameters.wrapR			= wrapModes[wrapMode].mode;
					testParameters.wrapS			= wrapModes[wrapMode].mode;
					testParameters.wrapT			= wrapModes[wrapMode].mode;
					testParameters.format			= VK_FORMAT_R8G8B8A8_UNORM;
					testParameters.programs.push_back(PROGRAM_3D_FLOAT);

					for (int size = 0; size < sizeEnd; size++)
					{
						testParameters.width			= tex3DSizes[size].width;
						testParameters.height			= tex3DSizes[size].height;
						testParameters.depth			= tex3DSizes[size].depth;

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << wrapModes[wrapMode].name;

						if (tex3DSizes[size].name)
							name << "_" << tex3DSizes[size].name;

						coordTypeGroup->addChild(new TextureTestCase<Texture3DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			group3D->addChild(coordTypeGroup.release());
		}

		// 3D bias variants.
		{
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.coordType			= COORDTYPE_BASIC_BIAS;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.wrapR				= Sampler::REPEAT_GL;
				testParameters.wrapS				= Sampler::REPEAT_GL;
				testParameters.wrapT				= Sampler::REPEAT_GL;
				testParameters.format				= VK_FORMAT_R8G8B8A8_UNORM;
				testParameters.width				= tex3DSizes[0].width;
				testParameters.height				= tex3DSizes[0].height;
				testParameters.depth				= tex3DSizes[0].depth;

				testParameters.programs.push_back(PROGRAM_3D_FLOAT);
				testParameters.programs.push_back(PROGRAM_3D_FLOAT_BIAS);

				biasGroup3D->addChild(new TextureTestCase<Texture3DMipmapTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		// 3D LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				minLodGroup3D->addChild(new TextureTestCase<Texture3DMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				maxLodGroup3D->addChild(new TextureTestCase<Texture3DMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.minFilterName		= minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				baseLevelGroup3D->addChild(new TextureTestCase<Texture3DBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.minFilterName		= minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				maxLevelGroup3D->addChild(new TextureTestCase<Texture3DMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		group3D->addChild(biasGroup3D.release());
		group3D->addChild(minLodGroup3D.release());
		group3D->addChild(maxLodGroup3D.release());
		group3D->addChild(baseLevelGroup3D.release());
		group3D->addChild(maxLevelGroup3D.release());

		textureMipmappingTests->addChild(group3D.release());
	}
}